

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool
replace_item_in_object(cJSON *object,char *string,cJSON *replacement,cJSON_bool case_sensitive)

{
  uchar *puVar1;
  cJSON *item;
  cJSON_bool case_sensitive_local;
  cJSON *replacement_local;
  char *string_local;
  cJSON *object_local;
  
  if (replacement == (cJSON *)0x0) {
    object_local._4_4_ = 0;
  }
  else {
    if (((replacement->type & 0x200U) == 0) && (replacement->string != (char *)0x0)) {
      cJSON_free(replacement->string);
    }
    puVar1 = cJSON_strdup((uchar *)string,&global_hooks);
    replacement->string = (char *)puVar1;
    replacement->type = replacement->type & 0xfffffdff;
    item = get_object_item(object,string,case_sensitive);
    cJSON_ReplaceItemViaPointer(object,item,replacement);
    object_local._4_4_ = 1;
  }
  return object_local._4_4_;
}

Assistant:

static cJSON_bool replace_item_in_object(cJSON *object, const char *string, cJSON *replacement, cJSON_bool case_sensitive)
{
    if (replacement == NULL)
    {
        return false;
    }

    /* replace the name in the replacement */
    if (!(replacement->type & cJSON_StringIsConst) && (replacement->string != NULL))
    {
        cJSON_free(replacement->string);
    }
    replacement->string = (char*)cJSON_strdup((const unsigned char*)string, &global_hooks);
    replacement->type &= ~cJSON_StringIsConst;

    cJSON_ReplaceItemViaPointer(object, get_object_item(object, string, case_sensitive), replacement);

    return true;
}